

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS1.cpp
# Opt level: O3

bool __thiscall RTIMULSM9DS1::IMUInit(RTIMULSM9DS1 *this)

{
  RTIMUSettings *this_00;
  bool bVar1;
  uchar uVar2;
  undefined8 in_RAX;
  char *__format;
  uchar result;
  uchar local_11;
  
  local_11 = (uchar)((ulong)in_RAX >> 0x38);
  (this->super_RTIMU).m_imuData.fusionPoseValid = false;
  (this->super_RTIMU).m_imuData.fusionQPoseValid = false;
  (this->super_RTIMU).m_imuData.gyroValid = true;
  (this->super_RTIMU).m_imuData.accelValid = true;
  (this->super_RTIMU).m_imuData.compassValid = true;
  (this->super_RTIMU).m_imuData.pressureValid = false;
  (this->super_RTIMU).m_imuData.temperatureValid = false;
  (this->super_RTIMU).m_imuData.humidityValid = false;
  this_00 = (this->super_RTIMU).m_settings;
  this->m_accelGyroSlaveAddr = this_00->m_I2CSlaveAddress;
  bVar1 = RTIMUHal::HALRead(&this_00->super_RTIMUHal,'\x1c','\x0f','\x01',&local_11,"");
  if (bVar1) {
    uVar2 = '\x1c';
LAB_0011a246:
    if (local_11 == '=') {
      this->m_magSlaveAddr = uVar2;
    }
  }
  else {
    bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,'\x1d','\x0f','\x01'
                              ,&local_11,"");
    if (bVar1) {
      uVar2 = '\x1d';
      goto LAB_0011a246;
    }
    bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,'\x1e','\x0f','\x01'
                              ,&local_11,"");
    if (bVar1) {
      uVar2 = '\x1e';
      goto LAB_0011a246;
    }
    bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,'\x1f','\x0f','\x01'
                              ,&local_11,"");
    if (bVar1) {
      uVar2 = '\x1f';
      goto LAB_0011a246;
    }
  }
  RTIMU::setCalibrationData(&this->super_RTIMU);
  bVar1 = RTIMUHal::HALOpen(&((this->super_RTIMU).m_settings)->super_RTIMUHal);
  if ((bVar1) &&
     (bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                 this->m_accelGyroSlaveAddr,'\"',0x80,"Failed to boot LSM9DS1"),
     bVar1)) {
    RTIMUHal::delayMs(&((this->super_RTIMU).m_settings)->super_RTIMUHal,100);
    bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                              this->m_accelGyroSlaveAddr,'\x0f','\x01',&local_11,
                              "Failed to read LSM9DS1 accel/gyro id");
    if (bVar1) {
      if (local_11 != 'h') {
        __format = "Incorrect LSM9DS1 gyro id %d\n";
LAB_0011a404:
        fprintf(_stderr,__format);
        return false;
      }
      bVar1 = setGyroSampleRate(this);
      if (((bVar1) && (bVar1 = setGyroCTRL3(this), bVar1)) &&
         (bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                    this->m_magSlaveAddr,'\x0f','\x01',&local_11,
                                    "Failed to read LSM9DS1 accel/mag id"), bVar1)) {
        if (local_11 != '=') {
          __format = "Incorrect LSM9DS1 accel/mag id %d\n";
          goto LAB_0011a404;
        }
        bVar1 = setAccelCTRL6(this);
        if (bVar1) {
          bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                     this->m_accelGyroSlaveAddr,'!','\0',
                                     "Failed to set LSM9DS1 accel CTRL7");
          if (!bVar1) {
            return false;
          }
          bVar1 = setCompassCTRL1(this);
          if ((bVar1) && (bVar1 = setCompassCTRL2(this), bVar1)) {
            bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                       this->m_magSlaveAddr,'\"','\0',
                                       "Failed to set LSM9DS1 compass CTRL3");
            if (!bVar1) {
              return false;
            }
            RTIMU::gyroBiasInit(&this->super_RTIMU);
            puts("LSM9DS1 init complete");
            fflush(_stdout);
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool RTIMULSM9DS1::IMUInit()
{
    unsigned char result;

    // set validity flags

    m_imuData.fusionPoseValid = false;
    m_imuData.fusionQPoseValid = false;
    m_imuData.gyroValid = true;
    m_imuData.accelValid = true;
    m_imuData.compassValid = true;
    m_imuData.pressureValid = false;
    m_imuData.temperatureValid = false;
    m_imuData.humidityValid = false;

    //  configure IMU

    m_accelGyroSlaveAddr = m_settings->m_I2CSlaveAddress;

    // work outmag address

    if (m_settings->HALRead(LSM9DS1_MAG_ADDRESS0, LSM9DS1_MAG_WHO_AM_I, 1, &result, "")) {
        if (result == LSM9DS1_MAG_ID) {
            m_magSlaveAddr = LSM9DS1_MAG_ADDRESS0;
        }
    } else if (m_settings->HALRead(LSM9DS1_MAG_ADDRESS1, LSM9DS1_MAG_WHO_AM_I, 1, &result, "")) {
        if (result == LSM9DS1_MAG_ID) {
            m_magSlaveAddr = LSM9DS1_MAG_ADDRESS1;
        }
    } else if (m_settings->HALRead(LSM9DS1_MAG_ADDRESS2, LSM9DS1_MAG_WHO_AM_I, 1, &result, "")) {
        if (result == LSM9DS1_MAG_ID) {
            m_magSlaveAddr = LSM9DS1_MAG_ADDRESS2;
        }
    } else if (m_settings->HALRead(LSM9DS1_MAG_ADDRESS3, LSM9DS1_MAG_WHO_AM_I, 1, &result, "")) {
        if (result == LSM9DS1_MAG_ID) {
            m_magSlaveAddr = LSM9DS1_MAG_ADDRESS3;
        }
    }

    setCalibrationData();

    //  enable the I2C bus

    if (!m_settings->HALOpen())
        return false;

    //  Set up the gyro/accel

    if (!m_settings->HALWrite(m_accelGyroSlaveAddr, LSM9DS1_CTRL8, 0x80, "Failed to boot LSM9DS1"))
        return false;

    m_settings->delayMs(100);

    if (!m_settings->HALRead(m_accelGyroSlaveAddr, LSM9DS1_WHO_AM_I, 1, &result, "Failed to read LSM9DS1 accel/gyro id"))
        return false;

    if (result != LSM9DS1_ID) {
        HAL_ERROR1("Incorrect LSM9DS1 gyro id %d\n", result);
        return false;
    }

    if (!setGyroSampleRate())
            return false;

    if (!setGyroCTRL3())
            return false;

    //  Set up the mag

    if (!m_settings->HALRead(m_magSlaveAddr, LSM9DS1_MAG_WHO_AM_I, 1, &result, "Failed to read LSM9DS1 accel/mag id"))
        return false;

    if (result != LSM9DS1_MAG_ID) {
        HAL_ERROR1("Incorrect LSM9DS1 accel/mag id %d\n", result);
        return false;
    }

    if (!setAccelCTRL6())
        return false;

    if (!setAccelCTRL7())
        return false;

    if (!setCompassCTRL1())
        return false;

    if (!setCompassCTRL2())
        return false;

    if (!setCompassCTRL3())
        return false;

    gyroBiasInit();

    HAL_INFO("LSM9DS1 init complete\n");
    return true;
}